

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamTaperedTimoshenko.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementBeamTaperedTimoshenko::ComputeInternalForces
          (ChElementBeamTaperedTimoshenko *this,ChVectorDynamic<> *Fi,bool Mfactor,bool Kfactor,
          bool Rfactor,bool Gfactor)

{
  ChQuaternion<double> *q;
  undefined8 uVar1;
  long lVar2;
  long start;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ChVectorDynamic<> FiMKR_local;
  vector<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_> R;
  double node_multiplier;
  undefined1 local_208 [48];
  ChMatrix33<double> Atoabs;
  ChMatrix33<double> AtolocwelA;
  Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> local_148;
  ChVector<double> mTgyro_i;
  ChVector<double> mFcent_i;
  ChVector<double> *local_c8 [3];
  ChVector<double> **local_b0 [2];
  ChMatrix33<double> AtolocwelB;
  ChMatrixRef local_58;
  
  if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows != 0xc)
  {
    __assert_fail("Fi.size() == 12",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementBeamTaperedTimoshenko.cpp"
                  ,0x44c,
                  "virtual void chrono::fea::ChElementBeamTaperedTimoshenko::ComputeInternalForces(ChVectorDynamic<> &, bool, bool, bool, bool)"
                 );
  }
  if ((this->tapered_section).
      super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    Atoabs.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]._0_4_ =
         0xc;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
              ((Matrix<double,__1,_1,_0,__1,_1> *)&FiMKR_local,(int *)&Atoabs);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&FiMKR_local);
    if (Mfactor) {
      AtolocwelA.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]._0_4_ =
           0xc;
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
                ((Matrix<double,__1,_1,_0,__1,_1> *)&Atoabs,(int *)&AtolocwelA);
      GetField_dtdt(this,(ChVectorDynamic<> *)&Atoabs);
      AtolocwelB.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array._0_16_ =
           Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::operator*
                     ((MatrixBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&this->M,
                      (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&Atoabs);
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&AtolocwelA,
                 (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                  *)&AtolocwelB);
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-=
                ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&FiMKR_local,
                 (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&AtolocwelA);
      Eigen::internal::handmade_aligned_free
                ((void *)CONCAT44(AtolocwelA.super_Matrix<double,_3,_3,_1,_3,_3>.
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                  m_storage.m_data.array[0]._4_4_,
                                  AtolocwelA.super_Matrix<double,_3,_3,_1,_3,_3>.
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                  m_storage.m_data.array[0]._0_4_));
      Eigen::internal::handmade_aligned_free
                ((void *)CONCAT44(Atoabs.super_Matrix<double,_3,_3,_1,_3,_3>.
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                  m_storage.m_data.array[0]._4_4_,
                                  Atoabs.super_Matrix<double,_3,_3,_1,_3,_3>.
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                  m_storage.m_data.array[0]._0_4_));
    }
    if (Kfactor) {
      AtolocwelA.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]._0_4_ =
           0xc;
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
                ((Matrix<double,__1,_1,_0,__1,_1> *)&Atoabs,(int *)&AtolocwelA);
      (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase
        [6])(this,&Atoabs);
      AtolocwelB.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array._0_16_ =
           Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::operator*
                     ((MatrixBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&this->Km,
                      (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&Atoabs);
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&AtolocwelA,
                 (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                  *)&AtolocwelB);
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-=
                ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&FiMKR_local,
                 (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&AtolocwelA);
      Eigen::internal::handmade_aligned_free
                ((void *)CONCAT44(AtolocwelA.super_Matrix<double,_3,_3,_1,_3,_3>.
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                  m_storage.m_data.array[0]._4_4_,
                                  AtolocwelA.super_Matrix<double,_3,_3,_1,_3,_3>.
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                  m_storage.m_data.array[0]._0_4_));
      Eigen::internal::handmade_aligned_free
                ((void *)CONCAT44(Atoabs.super_Matrix<double,_3,_3,_1,_3,_3>.
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                  m_storage.m_data.array[0]._4_4_,
                                  Atoabs.super_Matrix<double,_3,_3,_1,_3,_3>.
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                  m_storage.m_data.array[0]._0_4_));
    }
    if (Rfactor) {
      Atoabs.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]._0_4_ =
           0xc;
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
                ((Matrix<double,__1,_1,_0,__1,_1> *)&AtolocwelA,(int *)&Atoabs);
      GetField_dt(this,(ChVectorDynamic<> *)&AtolocwelA);
      AtolocwelB.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array._0_16_ =
           Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::operator*
                     ((MatrixBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&this->Rm,
                      (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&AtolocwelA);
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::
      PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&Atoabs,
                 (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                  *)&AtolocwelB);
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-=
                ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&FiMKR_local,
                 (MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&Atoabs);
      Eigen::internal::handmade_aligned_free
                ((void *)CONCAT44(Atoabs.super_Matrix<double,_3,_3,_1,_3,_3>.
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                  m_storage.m_data.array[0]._4_4_,
                                  Atoabs.super_Matrix<double,_3,_3,_1,_3,_3>.
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                  m_storage.m_data.array[0]._0_4_));
      Eigen::internal::handmade_aligned_free
                ((void *)CONCAT44(AtolocwelA.super_Matrix<double,_3,_3,_1,_3,_3>.
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                  m_storage.m_data.array[0]._4_4_,
                                  AtolocwelA.super_Matrix<double,_3,_3,_1,_3,_3>.
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                  m_storage.m_data.array[0]._0_4_));
    }
    q = &this->q_element_abs_rot;
    ChMatrix33<double>::Set_A_quaternion(&Atoabs,q);
    GetNodeA((ChElementBeamTaperedTimoshenko *)local_208);
    local_148.
    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .
    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
    .m_data = *(PointerType *)(local_208._0_8_ + 0x38);
    auVar4._0_8_ = (ulong)*(_func_int **)(local_208._0_8_ + 0x50) ^ 0x8000000000000000;
    auVar4._8_8_ = 0x8000000000000000;
    local_148.
    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .
    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
    .m_rows.m_value = (ulong)*(_func_int **)(local_208._0_8_ + 0x40) ^ 0x8000000000000000;
    local_148.
    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .
    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
    .m_cols.m_value = (ulong)*(_func_int **)(local_208._0_8_ + 0x48) ^ 0x8000000000000000;
    local_148.
    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .m_stride.m_outer.m_value = vmovlpd_avx(auVar4);
    ChQuaternion<double>::operator%
              ((ChQuaternion<double> *)&AtolocwelB,(ChQuaternion<double> *)&local_148,q);
    ChMatrix33<double>::Set_A_quaternion(&AtolocwelA,(ChQuaternion<double> *)&AtolocwelB);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_208 + 8));
    GetNodeB((ChElementBeamTaperedTimoshenko *)&R);
    local_208._0_8_ =
         R.
         super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
         ._M_impl.super__Vector_impl_data._M_start[7];
    auVar5._0_8_ = (ulong)R.
                          super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[10] ^ 0x8000000000000000;
    auVar5._8_8_ = 0x8000000000000000;
    local_208._8_8_ =
         (ulong)R.
                super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                ._M_impl.super__Vector_impl_data._M_start[8] ^ 0x8000000000000000;
    local_208._16_8_ =
         (ulong)R.
                super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                ._M_impl.super__Vector_impl_data._M_start[9] ^ 0x8000000000000000;
    local_208._24_8_ = vmovlpd_avx(auVar5);
    ChQuaternion<double>::operator%
              ((ChQuaternion<double> *)&local_148,(ChQuaternion<double> *)local_208,q);
    ChMatrix33<double>::Set_A_quaternion(&AtolocwelB,(ChQuaternion<double> *)&local_148);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &R.
                super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                ._M_impl.super__Vector_impl_data._M_finish);
    R.
    super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    R.
    super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    R.
    super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_148.
    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .
    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
    .m_data = (PointerType)&Atoabs;
    std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
    emplace_back<chrono::ChMatrix33<double>*>
              ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>> *)&R
               ,(ChMatrix33<double> **)&local_148);
    local_148.
    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .
    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
    .m_data = (PointerType)&AtolocwelA;
    std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
    emplace_back<chrono::ChMatrix33<double>*>
              ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>> *)&R
               ,(ChMatrix33<double> **)&local_148);
    local_148.
    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .
    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
    .m_data = (PointerType)&Atoabs;
    std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
    emplace_back<chrono::ChMatrix33<double>*>
              ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>> *)&R
               ,(ChMatrix33<double> **)&local_148);
    local_148.
    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .
    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
    .m_data = (PointerType)&AtolocwelB;
    std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
    emplace_back<chrono::ChMatrix33<double>*>
              ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>> *)&R
               ,(ChMatrix33<double> **)&local_148);
    Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>::
    Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>> *)&local_148,
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&FiMKR_local,(type *)0x0);
    Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::OuterStride<-1>>::
    Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>> *)&local_58,
               &Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(type *)0x0);
    ChMatrixCorotation::ComputeCK(&local_148,&R,4,&local_58);
    Eigen::internal::handmade_aligned_free
              (local_148.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_data);
    if (Gfactor) {
      start = 0;
      lVar2 = 0;
      node_multiplier = (this->super_ChElementBeam).length * 0.5;
      mFcent_i.m_data[2] = 0.0;
      mTgyro_i.m_data[2] = 0.0;
      mFcent_i.m_data[0] = 0.0;
      mFcent_i.m_data[1] = 0.0;
      mTgyro_i.m_data[0] = 0.0;
      mTgyro_i.m_data[1] = 0.0;
      for (uVar3 = 0;
          uVar3 < (ulong)((long)(this->nodes).
                                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->nodes).
                                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4); uVar3 = uVar3 + 1)
      {
        if (lVar2 == 0) {
          std::
          __shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
          ::__shared_ptr((__shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                          *)local_208,
                         &(((this->tapered_section).
                            super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->sectionA).
                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                        );
          uVar1 = local_208._0_8_;
          ChFrameMoving<double>::GetWvel_loc
                    ((ChVector<double> *)&local_148,
                     (ChFrameMoving<double> *)
                     &(((((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr)->super_ChNodeFEAbase).field_0x18);
          (**(code **)(*(_func_int **)uVar1 + 0x80))(uVar1,&mFcent_i,&mTgyro_i,&local_148);
        }
        else {
          std::
          __shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
          ::__shared_ptr((__shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                          *)local_208,
                         &(((this->tapered_section).
                            super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->sectionB).
                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                        );
          uVar1 = local_208._0_8_;
          ChFrameMoving<double>::GetWvel_loc
                    ((ChVector<double> *)&local_148,
                     (ChFrameMoving<double> *)
                     (*(long *)((long)&(((this->nodes).
                                         super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                                       )._M_ptr + lVar2) + 0x18));
          (**(code **)(*(_func_int **)uVar1 + 0x80))(uVar1,&mFcent_i,&mTgyro_i,&local_148);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_208 + 8));
        ChMatrix33<double>::operator*
                  ((ChMatrix33<double> *)
                   (*(long *)((long)&(((this->nodes).
                                       super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr + lVar2) + 0x58),&mFcent_i);
        local_b0[0] = local_c8;
        Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                          *)local_208,&node_multiplier,(StorageBaseType *)local_b0);
        Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                  ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&local_148,Fi,start,3)
        ;
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>::operator-=
                  ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>> *)
                   &local_148,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                    *)local_208);
        local_c8[0] = &mTgyro_i;
        Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                          *)local_208,&node_multiplier,(StorageBaseType *)local_c8);
        Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                  ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&local_148,Fi,
                   start + 3,3);
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>::operator-=
                  ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>> *)
                   &local_148,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                    *)local_208);
        lVar2 = lVar2 + 0x10;
        start = start + 6;
      }
    }
    std::_Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>::
    ~_Vector_base(&R.
                   super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                 );
    Eigen::internal::handmade_aligned_free
              (FiMKR_local.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data);
    return;
  }
  __assert_fail("tapered_section",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementBeamTaperedTimoshenko.cpp"
                ,0x44d,
                "virtual void chrono::fea::ChElementBeamTaperedTimoshenko::ComputeInternalForces(ChVectorDynamic<> &, bool, bool, bool, bool)"
               );
}

Assistant:

void ChElementBeamTaperedTimoshenko::ComputeInternalForces(ChVectorDynamic<>& Fi,
                                                           bool Mfactor,
                                                           bool Kfactor,
                                                           bool Rfactor,
                                                           bool Gfactor) {
    assert(Fi.size() == 12);
    assert(tapered_section);

    ChVectorDynamic<> FiMKR_local(12);
    FiMKR_local.setZero();

    if (Mfactor && true) {
        // set up vector of nodal accelerations (in local element system)
        ChVectorDynamic<> displ_dtdt(12);
        this->GetField_dtdt(displ_dtdt);

        ChVectorDynamic<> FiM_local = this->M * displ_dtdt;  // this->M is the local mass matrix of element
        FiMKR_local -= FiM_local;
    }

    if (Kfactor) {
        // set up vector of nodal displacements and small rotations (in local element system)
        ChVectorDynamic<> displ(12);
        this->GetStateBlock(displ);

        // [local Internal Forces] = [Klocal] * displ + [Rlocal] * displ_dt
        ChVectorDynamic<> FiK_local = this->Km * displ;
        FiMKR_local -= FiK_local;
    }
    if (Rfactor) {
        // set up vector of nodal velocities (in local element system)
        ChVectorDynamic<> displ_dt(12);
        this->GetField_dt(displ_dt);

        // ChMatrixDynamic<> FiR_local = this->tapered_section->GetBeamRaleyghDamping() * this->Km * displ_dt;
        ChMatrixDynamic<> FiR_local = this->Rm * displ_dt;
        FiMKR_local -= FiR_local;
    }

    //
    // Corotate local internal loads
    //

    // Fi = C * Fi_local  with C block-diagonal rotations A  , for nodal forces in abs. frame
    ChMatrix33<> Atoabs(this->q_element_abs_rot);
    ChMatrix33<> AtolocwelA(this->GetNodeA()->Frame().GetRot().GetConjugate() % this->q_element_abs_rot);
    ChMatrix33<> AtolocwelB(this->GetNodeB()->Frame().GetRot().GetConjugate() % this->q_element_abs_rot);
    std::vector<ChMatrix33<>*> R;
    R.push_back(&Atoabs);
    R.push_back(&AtolocwelA);
    R.push_back(&Atoabs);
    R.push_back(&AtolocwelB);
    ChMatrixCorotation::ComputeCK(FiMKR_local, R, 4, Fi);

    // DO NOT USE THIS PIECE OF CODE.
    // if (Mfactor && false) {  // Is this correct? Or the code in lines 1029~1036
    //    // set up vector of nodal accelarations (in absolute element system)
    //    ChVectorDynamic<> displ_dtdt(12);
    //    displ_dtdt.segment(0, 3) = nodes[0]->Frame().GetPos_dtdt().eigen();
    //    // displ_dtdt.segment(3, 3) = nodes[0]->Frame().GetWacc_par().eigen();        //但是之后dynamics求解发散
    //    displ_dtdt.segment(3, 3) = nodes[0]->Frame().GetWacc_loc().eigen();  //但是之后dynamics求解发散

    //    displ_dtdt.segment(6, 3) = nodes[1]->Frame().GetPos_dtdt().eigen();
    //    // displ_dtdt.segment(9, 3) = nodes[1]->Frame().GetWacc_par().eigen();
    //    displ_dtdt.segment(9, 3) = nodes[1]->Frame().GetWacc_loc().eigen();
    //    // this->GetField_dtdt(displ_dtdt);

    //    ChMatrixDynamic<> Mabs(12, 12);
    //    Mabs.setZero();
    //    this->ComputeKRMmatricesGlobal(Mabs, false, false,
    //                                   true);  // Mabs is the mass matrix in absolute coordinate for this element

    //    ChVectorDynamic<> FiM_abs = Mabs * displ_dtdt;
    //    Fi -= FiM_abs;
    //}

    if (Gfactor) {
        // Add also inertial quadratic terms: gyroscopic and centrifugal

        // CASE OF LUMPED MASS - fast
        double node_multiplier = 0.5 * length;
        ChVector<> mFcent_i;
        ChVector<> mTgyro_i;
        for (int i = 0; i < nodes.size(); ++i) {
            // int stride = i * 6;
            if (i == 0) {
                this->tapered_section->GetSectionA()->ComputeQuadraticTerms(mFcent_i, mTgyro_i,
                                                                            nodes[i]->GetWvel_loc());
            } else {  // i==1
                this->tapered_section->GetSectionB()->ComputeQuadraticTerms(mFcent_i, mTgyro_i,
                                                                            nodes[i]->GetWvel_loc());
            }
            ChQuaternion<> q_i(nodes[i]->GetRot());
            Fi.segment(i * 6, 3) -= node_multiplier * (nodes[i]->GetA() * mFcent_i).eigen();
            Fi.segment(3 + i * 6, 3) -= node_multiplier * mTgyro_i.eigen();
        }
    }

#ifdef BEAM_VERBOSE
    GetLog() << "\nInternal forces (local): \n";
    for (int c = 0; c < 6; c++)
        GetLog() << FiK_local(c) << "  ";
    GetLog() << "\n";
    for (int c = 6; c < 12; c++)
        GetLog() << FiK_local(c) << "  ";
    GetLog() << "\n\nInternal forces (ABS) : \n";
    for (int c = 0; c < 6; c++)
        GetLog() << Fi(c) << "  ";
    GetLog() << "\n";
    for (int c = 6; c < 12; c++)
        GetLog() << Fi(c) << "  ";
    GetLog() << "\n";
#endif
}